

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::dragMoveEvent(QTextEdit *this,QDragMoveEvent *e)

{
  QTextEditPrivate *this_00;
  QPoint QVar1;
  long in_FS_OFFSET;
  QPointF local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_38.xp = *(qreal *)(e + 0x10);
  local_38.yp = *(qreal *)(e + 0x18);
  QVar1 = QPointF::toPoint(&local_38);
  this_00->autoScrollDragPos = QVar1;
  if ((this_00->autoScrollTimer).m_id == Invalid) {
    QBasicTimer::start(&this_00->autoScrollTimer,(Duration)0x5f5e100,(QObject *)this);
  }
  QTextEditPrivate::sendControlEvent(this_00,(QEvent *)e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QTextEdit);
    d->autoScrollDragPos = e->position().toPoint();
    if (!d->autoScrollTimer.isActive())
        d->autoScrollTimer.start(100, this);
    d->sendControlEvent(e);
}